

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall TestEncoding::testEncoding<long>(TestEncoding *this,long start,long stop)

{
  ostream *poVar1;
  long in_RDX;
  long in_RSI;
  long i;
  long diff;
  long val;
  int64_t in_stack_00000088;
  TestEncoding *in_stack_00000090;
  long local_30;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"testing from ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1," to ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDX);
  std::operator<<(poVar1," inclusive\n");
  for (local_30 = 0; local_30 < (in_RDX - in_RSI) + 1; local_30 = local_30 + 1) {
    compare(in_stack_00000090,in_stack_00000088);
  }
  return;
}

Assistant:

void testEncoding(IntType start, IntType stop)
    {
        std::cout << "testing from " << start << " to " << stop << " inclusive\n";
        IntType val = start;
        IntType diff = stop - start + 1;

        for(IntType i = 0; i < diff; ++i) {
            compare(val+i);
        }
    }